

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

value loader_impl_metadata_handle(loader_handle_impl handle_impl)

{
  loader_handle_impl handle_impl_00;
  value pvVar1;
  loader_impl plVar2;
  value v;
  value *v_ptr;
  value local_8;
  
  local_8 = (value)value_create_map(0,2);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    handle_impl_00 = (loader_handle_impl)value_to_map(local_8);
    pvVar1 = loader_impl_metadata_handle_name(handle_impl_00);
    handle_impl_00->magic = (uintptr_t)pvVar1;
    if (handle_impl_00->magic == 0) {
      value_type_destroy(local_8);
      local_8 = (value)0x0;
    }
    else {
      plVar2 = (loader_impl)loader_impl_metadata_handle_context(handle_impl_00);
      handle_impl_00->impl = plVar2;
      if (handle_impl_00->impl == (loader_impl)0x0) {
        value_type_destroy(local_8);
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value loader_impl_metadata_handle(loader_handle_impl handle_impl)
{
	value *v_ptr, v = value_create_map(NULL, 2);

	if (v == NULL)
	{
		return NULL;
	}

	v_ptr = value_to_map(v);

	v_ptr[0] = loader_impl_metadata_handle_name(handle_impl);

	if (v_ptr[0] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	v_ptr[1] = loader_impl_metadata_handle_context(handle_impl);

	if (v_ptr[1] == NULL)
	{
		value_type_destroy(v);

		return NULL;
	}

	return v;
}